

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

char TagChar(w3Tag t)

{
  undefined1 local_9;
  w3Tag t_local;
  
  if (t == Tag_none) {
    local_9 = 'n';
  }
  else if (t == Tag_bool) {
    local_9 = 'b';
  }
  else if (t == Tag_any) {
    local_9 = 'a';
  }
  else if (t == Tag_empty) {
    local_9 = 'e';
  }
  else if (t == Tag_FuncRef) {
    local_9 = 'u';
  }
  else if (t == Tag_f64) {
    local_9 = 'g';
  }
  else if (t == Tag_f32) {
    local_9 = 'f';
  }
  else if (t == Tag_i64) {
    local_9 = 'j';
  }
  else if (t == Tag_i32) {
    local_9 = 'i';
  }
  else if (t == Tag_Value) {
    local_9 = 'v';
  }
  else if (t == Tag_Label) {
    local_9 = 'L';
  }
  else if (t == Tag_Frame) {
    local_9 = 'r';
  }
  else {
    local_9 = '$';
  }
  return local_9;
}

Assistant:

char TagChar(w3Tag t) //todo: short string?
{
    switch (t)
    {
    case Tag_none: return 'n';
    case Tag_bool: return 'b';
    case Tag_any: return 'a';
    //case Tag_i8: return 'c';
    //case Tag_u8: return 'd';
    //case Tag_i16: return 's';
    //case Tag_u16: return 't';
    case Tag_i32: return 'i';
    case Tag_i64: return 'j';
    case Tag_f32: return 'f';
    case Tag_f64: return 'g';
    case Tag_empty: return 'e';
    case Tag_Value: return 'v';
    case Tag_Label: return 'L';
    case Tag_Frame: return 'r';
    case Tag_FuncRef: return 'u';
    }
    return '$';
}